

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

suffix_table_type * __thiscall
frozen::boyer_moore_searcher<7UL>::build_suffix_table
          (suffix_table_type *__return_storage_ptr__,boyer_moore_searcher<7UL> *this,
          char (*needle) [8])

{
  bool bVar1;
  reference pvVar2;
  size_t sVar3;
  size_t slen;
  size_t p_1;
  ptrdiff_t p;
  ptrdiff_t last_prefix_index;
  suffix_table_type suffix;
  char (*needle_local) [8];
  boyer_moore_searcher<7UL> *this_local;
  
  suffix.data_[6] = (long)needle;
  bits::carray<long,_7UL>::carray((carray<long,_7UL> *)&last_prefix_index);
  p = 6;
  for (p_1 = 6; -1 < (long)p_1; p_1 = p_1 - 1) {
    bVar1 = is_prefix(this,(char (*) [8])suffix.data_[6],p_1 + 1);
    if (bVar1) {
      p = p_1 + 1;
    }
    pvVar2 = bits::carray<long,_7UL>::operator[]((carray<long,_7UL> *)&last_prefix_index,p_1);
    *pvVar2 = p + (6 - p_1);
  }
  for (slen = 0; slen < 6; slen = slen + 1) {
    sVar3 = suffix_length(this,(char (*) [8])suffix.data_[6],slen);
    if (*(char *)(suffix.data_[6] + (slen - sVar3)) != *(char *)(suffix.data_[6] + (6 - sVar3))) {
      pvVar2 = bits::carray<long,_7UL>::operator[]
                         ((carray<long,_7UL> *)&last_prefix_index,6 - sVar3);
      *pvVar2 = (6 - slen) + sVar3;
    }
  }
  memcpy(__return_storage_ptr__,&last_prefix_index,0x38);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto build_suffix_table(char const (&needle)[size + 1]) {
    suffix_table_type suffix;
    std::ptrdiff_t last_prefix_index = size - 1;

    // first loop
    for (std::ptrdiff_t p = size - 1; p >= 0; p--) {
      if (is_prefix(needle, p + 1))
        last_prefix_index = p + 1;

      suffix[p] = last_prefix_index + (size - 1 - p);
    }

    // second loop
    for (std::size_t p = 0; p < size - 1; p++) {
      auto slen = suffix_length(needle, p);
      if (needle[p - slen] != needle[size - 1 - slen])
        suffix[size - 1 - slen] = size - 1 - p + slen;

    }
    return suffix;
  }